

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8Wrap.c
# Opt level: O0

void XFreeUtf8FontStruct(Display *dpy,XUtf8FontStruct *font_set)

{
  int local_1c;
  int i;
  XUtf8FontStruct *font_set_local;
  Display *dpy_local;
  
  for (local_1c = 0; local_1c < font_set->nb_font; local_1c = local_1c + 1) {
    if (font_set->fonts[local_1c] != (XFontStruct *)0x0) {
      XFreeFont(dpy,font_set->fonts[local_1c]);
      free(font_set->font_name_list[local_1c]);
    }
  }
  free(font_set->ranges);
  free(font_set->font_name_list);
  free(font_set->fonts);
  free(font_set->encodings);
  free(font_set);
  return;
}

Assistant:

void
XFreeUtf8FontStruct(Display 	    *dpy,
		    XUtf8FontStruct *font_set) {

  int i;
  i = 0;
  while (i < font_set->nb_font) {
    if (font_set->fonts[i]) {
	XFreeFont(dpy, font_set->fonts[i]);
	free(font_set->font_name_list[i]);
    }
    i++;
  }
  free(font_set->ranges);
  free(font_set->font_name_list);
  free(font_set->fonts);
  free(font_set->encodings);
  free(font_set);
}